

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

int peekInternal(uint8_t distance)

{
  size_t *psVar1;
  Expansion *pEVar2;
  size_t sVar3;
  uint unaff_EBX;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  size_t sVar7;
  size_t nbChars;
  
  pEVar2 = lexerState->expansions;
  do {
    if (pEVar2 == (Expansion *)0x0) {
LAB_0010ea53:
      if (pEVar2 == (Expansion *)0x0) {
        if (0x29 < distance) {
          fatalerror("Internal lexer error: buffer has insufficient size for peeking (%u >= %u)\n",
                     (ulong)distance,0x2a);
        }
        uVar5 = (ulong)distance;
        if (lexerState->isMmapped == true) {
          uVar5 = uVar5 + (lexerState->field_2).field_0.offset;
          if ((lexerState->field_2).field_0.size <= uVar5) {
            return -1;
          }
          pbVar6 = (byte *)((lexerState->field_2).field_0.ptr + uVar5);
        }
        else {
          uVar4 = (lexerState->field_2).field_1.nbChars;
          if (uVar4 <= uVar5) {
            nbChars = 0x2a - uVar4;
            sVar7 = (uVar4 + (lexerState->field_2).field_0.size) % 0x2a;
            if (0x2a < sVar7 + nbChars) {
              uVar4 = 0x2a - sVar7;
              sVar3 = readInternal(sVar7,uVar4);
              psVar1 = &(lexerState->field_2).field_1.nbChars;
              *psVar1 = *psVar1 + sVar3;
              sVar7 = sVar7 + sVar3;
              if (sVar7 == 0x2a) {
                sVar7 = 0;
              }
              nbChars = nbChars - sVar3;
              if (sVar3 < uVar4) {
                nbChars = 0;
              }
            }
            if (nbChars != 0) {
              sVar7 = readInternal(sVar7,nbChars);
              psVar1 = &(lexerState->field_2).field_1.nbChars;
              *psVar1 = *psVar1 + sVar7;
            }
            if ((lexerState->field_2).field_1.nbChars <= uVar5) {
              return -1;
            }
          }
          pbVar6 = (byte *)((long)&lexerState->field_2 +
                           (uVar5 + (lexerState->field_2).field_0.size) % 0x2a + 0x10);
        }
        unaff_EBX = (uint)*pbVar6;
      }
      return unaff_EBX;
    }
    uVar5 = pEVar2->offset;
    uVar4 = pEVar2->size - uVar5;
    if (pEVar2->size < uVar5) {
      __assert_fail("exp->offset <= exp->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x330,"peekInternal");
    }
    if (distance < uVar4) {
      unaff_EBX = (uint)(pEVar2->contents).unowned[distance + uVar5];
      goto LAB_0010ea53;
    }
    distance = distance - (char)uVar4;
    pEVar2 = pEVar2->parent;
  } while( true );
}

Assistant:

static int peekInternal(uint8_t distance)
{
	for (struct Expansion *exp = lexerState->expansions; exp; exp = exp->parent) {
		// An expansion that has reached its end will have `exp->offset` == `exp->size`,
		// and `peekInternal` will continue with its parent
		assert(exp->offset <= exp->size);
		if (distance < exp->size - exp->offset)
			return exp->contents.unowned[exp->offset + distance];
		distance -= exp->size - exp->offset;
	}

	if (distance >= LEXER_BUF_SIZE)
		fatalerror("Internal lexer error: buffer has insufficient size for peeking (%"
			   PRIu8 " >= %u)\n", distance, LEXER_BUF_SIZE);

	if (lexerState->isMmapped) {
		if (lexerState->offset + distance >= lexerState->size)
			return EOF;

		return (unsigned char)lexerState->ptr[lexerState->offset + distance];
	}

	if (lexerState->nbChars <= distance) {
		// Buffer isn't full enough, read some chars in
		size_t target = LEXER_BUF_SIZE - lexerState->nbChars; // Aim: making the buf full

		// Compute the index we'll start writing to
		size_t writeIndex = (lexerState->index + lexerState->nbChars) % LEXER_BUF_SIZE;

		// If the range to fill passes over the buffer wrapping point, we need two reads
		if (writeIndex + target > LEXER_BUF_SIZE) {
			size_t nbExpectedChars = LEXER_BUF_SIZE - writeIndex;
			size_t nbReadChars = readInternal(writeIndex, nbExpectedChars);

			lexerState->nbChars += nbReadChars;

			writeIndex += nbReadChars;
			if (writeIndex == LEXER_BUF_SIZE)
				writeIndex = 0;

			// If the read was incomplete, don't perform a second read
			target -= nbReadChars;
			if (nbReadChars < nbExpectedChars)
				target = 0;
		}
		if (target != 0)
			lexerState->nbChars += readInternal(writeIndex, target);

		// If there aren't enough chars even after refilling, give up
		if (lexerState->nbChars <= distance)
			return EOF;
	}

	return (unsigned char)lexerState->buf[(lexerState->index + distance) % LEXER_BUF_SIZE];
}